

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_destroy(uo_cb *cb)

{
  long lVar1;
  uo_linklist *puVar2;
  uo_linklist *puVar3;
  uo_cb_func_linklist *cb_func_linklist;
  uo_linklist *puVar4;
  long *in_FS_OFFSET;
  
  free((cb->stack).items);
  puVar3 = &cb->funclist;
  puVar4 = (cb->funclist).next;
  if (puVar4 != puVar3) {
    lVar1 = *in_FS_OFFSET;
    do {
      puVar2 = puVar4->next;
      puVar2->prev = puVar4->prev;
      puVar4->prev->next = puVar2;
      puVar4->next = (uo_linklist *)0x0;
      puVar4->prev = (uo_linklist *)0x0;
      puVar2 = (uo_linklist *)in_FS_OFFSET[-4];
      puVar4->prev = puVar2;
      puVar2->next = puVar4;
      puVar4->next = (uo_linklist *)(lVar1 + -0x28);
      in_FS_OFFSET[-4] = (long)puVar4;
      puVar4 = puVar3->next;
    } while (puVar4 != puVar3);
  }
  if (cb[-1].funclist.next == (uo_linklist *)0x0) {
    lVar1 = *in_FS_OFFSET;
    puVar3 = (uo_linklist *)in_FS_OFFSET[-7];
    cb[-1].funclist.prev = puVar3;
    puVar3->next = &cb[-1].funclist;
    cb[-1].funclist.next = (uo_linklist *)(lVar1 + -0x40);
    in_FS_OFFSET[-7] = (long)&cb[-1].funclist;
    return;
  }
  __assert_fail("!uo__linklist_is_linked(link)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_linklist/src/include/uo_linklist/uo_linklist.h"
                ,0xa6,"void uo__linklist_link(uo_linklist *, uo_linklist *)");
}

Assistant:

void uo_cb_destroy(
    uo_cb *cb)
{
    uo_stack_destroy_at(&cb->stack);

    while (!uo_linklist_is_empty(&cb->funclist))
    {
        uo_cb_func_linklist *cb_func_linklist = (uo_cb_func_linklist *)uo_linklist_next(&cb->funclist);
        uo_linklist_unlink(cb_func_linklist);
        uo_cb_func_linkpool_return(cb_func_linklist);
    }

    uo_cb_linkpool_return(uo_cb_get_linklist(cb));
}